

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O2

void __thiscall sc_core::sc_event::trigger(sc_event *this)

{
  pointer ppsVar1;
  pointer ppsVar2;
  bool bVar3;
  ulong uVar4;
  int i;
  int iVar5;
  int iVar6;
  long lVar7;
  
  ppsVar1 = (this->m_methods_static).
            super__Vector_base<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this->m_trigger_stamp = this->m_simc->m_change_stamp;
  this->m_notify_type = NONE;
  this->m_delta_event_index = -1;
  this->m_timed = (sc_event_timed *)0x0;
  uVar4 = (long)(this->m_methods_static).
                super__Vector_base<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar1;
  if ((uVar4 & 0x7fffffff8) != 0) {
    lVar7 = (long)(int)(uVar4 >> 3) + 1;
    do {
      sc_method_process::trigger_static(ppsVar1[lVar7 + -2]);
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  ppsVar1 = (this->m_methods_dynamic).
            super__Vector_base<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = (int)((ulong)((long)(this->m_methods_dynamic).
                              super__Vector_base<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar1) >> 3);
  if (iVar6 != 0) {
    iVar6 = iVar6 + -1;
    for (iVar5 = 0; iVar5 <= iVar6; iVar5 = iVar5 + 1) {
      bVar3 = sc_method_process::trigger_dynamic(ppsVar1[iVar5],this);
      if (bVar3) {
        ppsVar1[iVar5] = ppsVar1[iVar6];
        iVar6 = iVar6 + -1;
        iVar5 = iVar5 + -1;
      }
    }
    std::vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>::resize
              (&this->m_methods_dynamic,(long)(iVar6 + 1),(value_type)0x0);
  }
  ppsVar2 = (this->m_threads_static).
            super__Vector_base<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->m_threads_static).
                super__Vector_base<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar2;
  if ((uVar4 & 0x7fffffff8) != 0) {
    lVar7 = (long)(int)(uVar4 >> 3) + 1;
    do {
      sc_thread_process::trigger_static(ppsVar2[lVar7 + -2]);
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  ppsVar2 = (this->m_threads_dynamic).
            super__Vector_base<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = (int)((ulong)((long)(this->m_threads_dynamic).
                              super__Vector_base<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar2) >> 3);
  if (iVar6 != 0) {
    iVar6 = iVar6 + -1;
    for (iVar5 = 0; iVar5 <= iVar6; iVar5 = iVar5 + 1) {
      bVar3 = sc_thread_process::trigger_dynamic(ppsVar2[iVar5],this);
      if (bVar3) {
        ppsVar2[iVar5] = ppsVar2[iVar6];
        iVar5 = iVar5 + -1;
        iVar6 = iVar6 + -1;
      }
    }
    std::vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>::resize
              (&this->m_threads_dynamic,(long)(iVar6 + 1),(value_type)0x0);
    return;
  }
  return;
}

Assistant:

void
sc_event::trigger()
{
    m_trigger_stamp = m_simc->change_stamp();
    m_notify_type = NONE;
    m_delta_event_index = -1;
    m_timed = 0;

    int       last_i; // index of last element in vector now accessing.
    int       size;   // size of vector now accessing.


    // trigger the static sensitive methods

    if( ( size = m_methods_static.size() ) != 0 )
    {
        sc_method_handle* l_methods_static = &m_methods_static[0];
        int i = size - 1;
        do {
            sc_method_handle method_h = l_methods_static[i];
            method_h->trigger_static();
        } while( -- i >= 0 );
    }

    // trigger the dynamic sensitive methods


    if( ( size = m_methods_dynamic.size() ) != 0 )
    {
	last_i = size - 1;
	sc_method_handle* l_methods_dynamic = &m_methods_dynamic[0];
	for ( int i = 0; i <= last_i; i++ )
	{
	    sc_method_handle method_h = l_methods_dynamic[i];
	    if ( method_h->trigger_dynamic( this ) )
	    {
		l_methods_dynamic[i] = l_methods_dynamic[last_i];
		last_i--;
		i--;
	    }
	}
        m_methods_dynamic.resize(last_i+1);
    }


    // trigger the static sensitive threads

    if( ( size = m_threads_static.size() ) != 0 )
    {
        sc_thread_handle* l_threads_static = &m_threads_static[0];
        int i = size - 1;
        do {
            sc_thread_handle thread_h = l_threads_static[i];
            thread_h->trigger_static();
        } while( -- i >= 0 );
    }

    // trigger the dynamic sensitive threads

    if( ( size = m_threads_dynamic.size() ) != 0 )
    {
	last_i = size - 1;
	sc_thread_handle* l_threads_dynamic = &m_threads_dynamic[0];
	for ( int i = 0; i <= last_i; i++ )
	{
	    sc_thread_handle thread_h = l_threads_dynamic[i];
	    if ( thread_h->trigger_dynamic( this ) )
	    {
		l_threads_dynamic[i] = l_threads_dynamic[last_i];
		i--;
		last_i--;
	    }
	}
        m_threads_dynamic.resize(last_i+1);
    }
}